

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::tessellation::anon_unknown_0::InvariantOuterEdge::OuterEdgeIndexIndependenceTestInstance::
iterate(TestStatus *__return_storage_ptr__,OuterEdgeIndexIndependenceTestInstance *this)

{
  ostream *poVar1;
  float fVar2;
  TestLog *pTVar3;
  Winding winding;
  TessPrimitiveType TVar4;
  pointer pOVar5;
  bool bVar6;
  _Rb_tree_header *p_Var7;
  TestStatus *pTVar8;
  _Link_type p_Var9;
  char *pcVar10;
  int wrapLengthParam;
  long lVar11;
  long lVar12;
  uint constantOuterLevelIndex;
  _Rb_tree_node_base *b;
  ulong uVar13;
  long lVar14;
  long lVar15;
  char *pcVar16;
  int numIndentationSpaces;
  ulong uVar17;
  OuterEdgeDescription *edgeDesc;
  int i;
  long lVar18;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar19;
  undefined1 local_318 [4];
  undefined8 local_314;
  TestStatus *local_2f8;
  Vec3Set currentEdgeVertices;
  vector<float,_std::allocator<float>_> patchTessLevels;
  Vec3Set firstEdgeVertices;
  float local_278;
  float fStack_274;
  string local_238;
  DrawResult result;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [384];
  
  lVar12 = 0;
  local_2f8 = __return_storage_ptr__;
  do {
    p_Var7 = &firstEdgeVertices._M_t._M_impl.super__Rb_tree_header;
    if (lVar12 == 0xc) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1b0,"OK",(allocator<char> *)&firstEdgeVertices);
      tcu::TestStatus::pass(local_2f8,(string *)local_1b0);
      std::__cxx11::string::~string((string *)local_1b0);
      return local_2f8;
    }
    firstEdgeVertices._M_t._M_impl._0_1_ = 0;
    firstEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    firstEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    firstEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    uVar13 = 0;
    firstEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var7->_M_header;
    firstEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var7->_M_header;
    while( true ) {
      pOVar5 = (this->super_BaseTestInstance).m_edgeDescriptions.
               super__Vector_base<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((long)(int)((ulong)((long)(this->super_BaseTestInstance).m_edgeDescriptions.
                                    super__Vector_base<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar5) >> 4)
          <= (long)uVar13) break;
      fVar2 = (float)(&tessellation::(anonymous_namespace)::InvariantOuterEdge::BaseTestInstance::
                       m_singleOuterEdgeLevels)[lVar12];
      constantOuterLevelIndex = (uint)uVar13;
      generatePatchTessLevels
                (&patchTessLevels,(this->super_BaseTestInstance).m_numPatchesToDraw,
                 constantOuterLevelIndex,fVar2);
      BaseTestInstance::uploadVertexAttributes(&this->super_BaseTestInstance,&patchTessLevels);
      edgeDesc = pOVar5 + uVar13;
      logOuterTessellationLevel
                (((this->super_BaseTestInstance).super_TestInstance.m_context)->m_testCtx->m_log,
                 fVar2,edgeDesc);
      winding = (this->super_BaseTestInstance).m_caseDef.winding;
      uVar17 = (ulong)winding;
      BaseTestInstance::draw
                (&result,&this->super_BaseTestInstance,
                 (deUint32)
                 ((ulong)((long)patchTessLevels.super__Vector_base<float,_std::allocator<float>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)patchTessLevels.super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 2),&patchTessLevels,
                 winding,(this->super_BaseTestInstance).m_caseDef.usePointMode);
      if (result.success == false) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1b0,"Invalid set of vertices",
                   (allocator<char> *)&currentEdgeVertices);
        tcu::TestStatus::fail(local_2f8,(string *)local_1b0);
        std::__cxx11::string::~string((string *)local_1b0);
        goto LAB_007102c5;
      }
      currentEdgeVertices._M_t._M_impl._0_1_ = 0;
      currentEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      currentEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      currentEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &currentEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_header;
      currentEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      lVar15 = 0x18;
      currentEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           currentEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      for (lVar11 = 0; numIndentationSpaces = (int)uVar17, lVar11 < result.numPrimitives;
          lVar11 = lVar11 + 1) {
        lVar18 = 0;
        lVar14 = lVar15;
        while( true ) {
          if (result.numPrimitiveVertices <= lVar18) break;
          fVar2 = *(float *)((long)(result.primitives.
                                    super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->unused_padding +
                            lVar14 + -8);
          pTVar3 = *(TestLog **)
                    ((long)(result.primitives.
                            super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                            ._M_impl.super__Vector_impl_data._M_start)->unused_padding +
                    lVar14 + -0x10);
          local_1b0._0_8_ = pTVar3;
          local_1b0._8_4_ = fVar2;
          bVar6 = OuterEdgeDescription::contains(edgeDesc,(Vec3 *)local_1b0);
          if (bVar6) {
            TVar4 = (this->super_BaseTestInstance).m_caseDef.primitiveType;
            local_278 = SUB84(pTVar3,0);
            fStack_274 = (float)((ulong)pTVar3 >> 0x20);
            if (TVar4 == TESSPRIMITIVETYPE_QUADS) {
              if (constantOuterLevelIndex < 4) {
                pTVar8 = (TestStatus *)
                         (*(code *)(&DAT_009bdb00 +
                                   *(int *)(&DAT_009bdb00 + (uVar13 & 0xffffffff) * 4)))();
                return pTVar8;
              }
              local_318 = (undefined1  [4])0xbf800000;
              local_314 = 0;
              pVar19 = std::
                       _Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                       ::_M_get_insert_unique_pos
                                 (&currentEdgeVertices._M_t,(Vector<float,_3> *)local_318);
              b = pVar19.second;
              if (b != (_Rb_tree_node_base *)0x0) {
                bVar6 = true;
                if (&currentEdgeVertices._M_t._M_impl.super__Rb_tree_header != (_Rb_tree_header *)b
                    && pVar19.first == (_Rb_tree_node_base *)0x0) {
                  bVar6 = LexCompare<tcu::Vector<float,_3>,_3,_std::less<float>_>::operator()
                                    ((LexCompare<tcu::Vector<float,_3>,_3,_std::less<float>_> *)
                                     local_318,(Vector<float,_3> *)(b + 1),(Vector<float,_3> *)b);
                }
                p_Var9 = std::
                         _Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                         ::_M_get_node(&currentEdgeVertices._M_t);
                tcu::Vector<float,_3>::Vector
                          ((Vector<float,_3> *)&p_Var9->_M_storage,(Vector<float,_3> *)local_318);
                std::_Rb_tree_insert_and_rebalance
                          (bVar6,&p_Var9->super__Rb_tree_node_base,b,
                           &currentEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_header);
                currentEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count =
                     currentEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count + 1;
              }
            }
            else if (TVar4 == TESSPRIMITIVETYPE_TRIANGLES) {
              if (constantOuterLevelIndex == 2) {
                local_314._4_4_ = local_278;
                local_314._0_4_ = fStack_274;
                local_318 = (undefined1  [4])fVar2;
              }
              else if (constantOuterLevelIndex == 1) {
                local_318 = (undefined1  [4])fStack_274;
                local_314._4_4_ = fVar2;
                local_314._0_4_ = local_278;
              }
              else if (constantOuterLevelIndex == 0) {
                tcu::Vector<float,_3>::Vector((Vector<float,_3> *)local_318,(Vec3 *)local_1b0);
              }
              else {
                tcu::Vector<float,_3>::Vector((Vector<float,_3> *)local_318,-1.0);
              }
              std::
              set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
              ::insert(&currentEdgeVertices,(Vector<float,_3> *)local_318);
            }
          }
          lVar18 = lVar18 + 1;
          lVar14 = lVar14 + 0x10;
        }
        lVar15 = lVar15 + 0x40;
      }
      if (uVar13 == 0) {
        std::
        set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
        ::operator=(&firstEdgeVertices,&currentEdgeVertices);
      }
      else {
        bVar6 = std::operator!=(&currentEdgeVertices,&firstEdgeVertices);
        wrapLengthParam = (int)lVar11;
        if (bVar6) {
          TVar4 = (this->super_BaseTestInstance).m_caseDef.primitiveType;
          if (TVar4 == TESSPRIMITIVETYPE_QUADS) {
            if (constantOuterLevelIndex == 1) {
              pcVar16 = "(x, 0)";
            }
            else {
              if (constantOuterLevelIndex != 2) {
                bVar6 = uVar13 == 3;
                pcVar10 = "(x, 0)";
                goto LAB_00710040;
              }
              pcVar16 = "(y, 0)";
            }
          }
          else if (TVar4 == TESSPRIMITIVETYPE_TRIANGLES) {
            if (uVar13 == 1) {
              pcVar16 = "(y, x, z)";
            }
            else {
              bVar6 = uVar13 == 2;
              pcVar10 = "(z, y, x)";
LAB_00710040:
              pcVar16 = (char *)0x0;
              if (bVar6) {
                pcVar16 = pcVar10;
              }
            }
          }
          else {
            pcVar16 = (char *)0x0;
          }
          pTVar3 = ((this->super_BaseTestInstance).super_TestInstance.m_context)->m_testCtx->m_log;
          local_1b0._0_8_ = pTVar3;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
          std::operator<<((ostream *)(local_1b0 + 8),"Failure: the set of vertices on the ");
          tessellation::(anonymous_namespace)::OuterEdgeDescription::description_abi_cxx11_
                    ((string *)local_318,edgeDesc);
          poVar1 = (ostream *)(local_1b0 + 8);
          std::operator<<(poVar1,(string *)local_318);
          std::operator<<(poVar1," edge");
          std::operator<<(poVar1," doesn\'t match the set of vertices on the ");
          tessellation::(anonymous_namespace)::OuterEdgeDescription::description_abi_cxx11_
                    (&local_238,
                     (this->super_BaseTestInstance).m_edgeDescriptions.
                     super__Vector_base<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription>_>
                     ._M_impl.super__Vector_impl_data._M_start);
          std::operator<<((ostream *)(local_1b0 + 8),(string *)&local_238);
          std::operator<<((ostream *)(local_1b0 + 8)," edge");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::string::~string((string *)&local_238);
          std::__cxx11::string::~string((string *)local_318);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
          local_1b0._0_8_ = pTVar3;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
          std::operator<<((ostream *)(local_1b0 + 8),"Note: set of vertices on ");
          tessellation::(anonymous_namespace)::OuterEdgeDescription::description_abi_cxx11_
                    ((string *)local_318,edgeDesc);
          poVar1 = (ostream *)(local_1b0 + 8);
          std::operator<<(poVar1,(string *)local_318);
          std::operator<<(poVar1," edge, components swizzled like ");
          std::operator<<(poVar1,pcVar16);
          std::operator<<(poVar1," to match component order on first edge:\n");
          containerStr<std::set<tcu::Vector<float,3>,vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,std::allocator<tcu::Vector<float,3>>>>
                    (&local_238,(tessellation *)&currentEdgeVertices,
                     (set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                      *)0x0,wrapLengthParam,numIndentationSpaces);
          std::operator<<((ostream *)(local_1b0 + 8),(string *)&local_238);
          std::operator<<((ostream *)(local_1b0 + 8),"\non ");
          tessellation::(anonymous_namespace)::OuterEdgeDescription::description_abi_cxx11_
                    (&local_1d0,
                     (this->super_BaseTestInstance).m_edgeDescriptions.
                     super__Vector_base<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription>_>
                     ._M_impl.super__Vector_impl_data._M_start);
          std::operator<<((ostream *)(local_1b0 + 8),(string *)&local_1d0);
          std::operator<<((ostream *)(local_1b0 + 8)," edge:\n");
          containerStr<std::set<tcu::Vector<float,3>,vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,std::allocator<tcu::Vector<float,3>>>>
                    (&local_1f0,(tessellation *)&firstEdgeVertices,
                     (set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                      *)0x0,wrapLengthParam,numIndentationSpaces);
          std::operator<<((ostream *)(local_1b0 + 8),(string *)&local_1f0);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::string::~string((string *)&local_1f0);
          std::__cxx11::string::~string((string *)&local_1d0);
          std::__cxx11::string::~string((string *)&local_238);
          std::__cxx11::string::~string((string *)local_318);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_1b0,"Invalid set of vertices",(allocator<char> *)local_318);
          tcu::TestStatus::fail(local_2f8,(string *)local_1b0);
          std::__cxx11::string::~string((string *)local_1b0);
          std::
          set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
          ::~set(&currentEdgeVertices);
LAB_007102c5:
          std::
          _Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
          ::~_Vector_base(&result.primitives.
                           super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                         );
          std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                    (&patchTessLevels.super__Vector_base<float,_std::allocator<float>_>);
          std::
          set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
          ::~set(&firstEdgeVertices);
          return local_2f8;
        }
      }
      std::
      set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
      ::~set(&currentEdgeVertices);
      std::
      _Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
      ::~_Vector_base(&result.primitives.
                       super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                     );
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&patchTessLevels.super__Vector_base<float,_std::allocator<float>_>);
      uVar13 = uVar13 + 1;
    }
    std::
    set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
    ::~set(&firstEdgeVertices);
    lVar12 = lVar12 + 1;
  } while( true );
}

Assistant:

tcu::TestStatus OuterEdgeIndexIndependenceTestInstance::iterate (void)
{
	for (int outerEdgeLevelCaseNdx = 0; outerEdgeLevelCaseNdx < DE_LENGTH_OF_ARRAY(m_singleOuterEdgeLevels); ++outerEdgeLevelCaseNdx)
	{
		Vec3Set firstEdgeVertices;

		for (int outerEdgeIndex = 0; outerEdgeIndex < static_cast<int>(m_edgeDescriptions.size()); ++outerEdgeIndex)
		{
			const OuterEdgeDescription& edgeDesc        = m_edgeDescriptions[outerEdgeIndex];
			const std::vector<float>    patchTessLevels = generatePatchTessLevels(m_numPatchesToDraw, outerEdgeIndex, m_singleOuterEdgeLevels[outerEdgeLevelCaseNdx]);

			uploadVertexAttributes(patchTessLevels);
			logOuterTessellationLevel(m_context.getTestContext().getLog(), m_singleOuterEdgeLevels[outerEdgeLevelCaseNdx], edgeDesc);
			const DrawResult result = draw(static_cast<deUint32>(patchTessLevels.size()), patchTessLevels, m_caseDef.winding, m_caseDef.usePointMode);

			// Verify case result

			if (!result.success)
				return tcu::TestStatus::fail("Invalid set of vertices");

			Vec3Set currentEdgeVertices;

			// Get the vertices on the current outer edge.
			for (int primitiveNdx = 0; primitiveNdx < result.numPrimitives; ++primitiveNdx)
			for (int i = 0; i < result.numPrimitiveVertices; ++i)
			{
				const tcu::Vec3& coord = result.primitives[primitiveNdx].tessCoord[i].swizzle(0, 1, 2);
				if (edgeDesc.contains(coord))
				{
					// Swizzle components to match the order of the first edge.
					if (m_caseDef.primitiveType == TESSPRIMITIVETYPE_TRIANGLES)
						currentEdgeVertices.insert(outerEdgeIndex == 0 ? coord :
												   outerEdgeIndex == 1 ? coord.swizzle(1, 0, 2) :
												   outerEdgeIndex == 2 ? coord.swizzle(2, 1, 0) : tcu::Vec3(-1.0f));
					else if (m_caseDef.primitiveType == TESSPRIMITIVETYPE_QUADS)
						currentEdgeVertices.insert(tcu::Vec3(outerEdgeIndex == 0 ? coord.y() :
															 outerEdgeIndex == 1 ? coord.x() :
															 outerEdgeIndex == 2 ? coord.y() :
															 outerEdgeIndex == 3 ? coord.x() : -1.0f,
															 0.0f, 0.0f));
					else
						DE_ASSERT(false);
				}
			}

			if (outerEdgeIndex == 0)
				firstEdgeVertices = currentEdgeVertices;
			else
			{
				// Compare vertices of this edge to those of the first edge.
				if (currentEdgeVertices != firstEdgeVertices)
				{
					const char* const swizzleDesc =
						m_caseDef.primitiveType == TESSPRIMITIVETYPE_TRIANGLES ? (outerEdgeIndex == 1 ? "(y, x, z)" :
																				  outerEdgeIndex == 2 ? "(z, y, x)" : DE_NULL) :
						m_caseDef.primitiveType == TESSPRIMITIVETYPE_QUADS ? (outerEdgeIndex == 1 ? "(x, 0)" :
																			  outerEdgeIndex == 2 ? "(y, 0)" :
																			  outerEdgeIndex == 3 ? "(x, 0)" : DE_NULL)
						: DE_NULL;

					tcu::TestLog& log = m_context.getTestContext().getLog();
					log << tcu::TestLog::Message
						<< "Failure: the set of vertices on the " << edgeDesc.description() << " edge"
						<< " doesn't match the set of vertices on the " << m_edgeDescriptions[0].description() << " edge"
						<< tcu::TestLog::EndMessage;

					log << tcu::TestLog::Message
						<< "Note: set of vertices on " << edgeDesc.description() << " edge, components swizzled like " << swizzleDesc
						<< " to match component order on first edge:\n" << containerStr(currentEdgeVertices, 5)
						<< "\non " << m_edgeDescriptions[0].description() << " edge:\n" << containerStr(firstEdgeVertices, 5)
						<< tcu::TestLog::EndMessage;

					return tcu::TestStatus::fail("Invalid set of vertices");
				}
			}
		}
	}
	return tcu::TestStatus::pass("OK");
}